

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O2

bool __thiscall
blcl::net::tsqueue<blcl::net::owned_message<MsgType>_>::empty
          (tsqueue<blcl::net::owned_message<MsgType>_> *this)

{
  _Elt_pointer poVar1;
  _Elt_pointer poVar2;
  
  std::mutex::lock(&this->queue_mtx_);
  poVar1 = (this->raw_deque_).
           super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  poVar2 = (this->raw_deque_).
           super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mtx_);
  return poVar1 == poVar2;
}

Assistant:

bool empty() {
            std::scoped_lock lock(queue_mtx_);
            return raw_deque_.empty();
        }